

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp)

{
  stbi_uc *__src;
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  stbi_uc *psVar7;
  int local_84;
  int len;
  stbi_uc *o;
  stbi__int32 h;
  stbi__int32 w;
  stbi__int32 y;
  stbi__int32 x;
  int prev_trans;
  stbi_uc *prev_out;
  int i;
  int req_comp_local;
  int *comp_local;
  stbi__gif *g_local;
  stbi__context *s_local;
  
  if ((g->out == (stbi_uc *)0x0) && (iVar3 = stbi__gif_header(s,g,comp,0), iVar3 == 0)) {
    s_local = (stbi__context *)0x0;
  }
  else {
    __src = g->out;
    psVar7 = (stbi_uc *)stbi__malloc((long)(g->w * 4 * g->h));
    g->out = psVar7;
    if (g->out == (stbi_uc *)0x0) {
      stbi__err("outofmem");
      s_local = (stbi__context *)0x0;
    }
    else {
      switch((g->eflags & 0x1cU) >> 2) {
      case 0:
        stbi__fill_gif_background(g,0,0,g->w << 2,g->w * 4 * g->h);
        break;
      case 1:
        if (__src != (stbi_uc *)0x0) {
          memcpy(g->out,__src,(long)(g->w * 4 * g->h));
        }
        g->old_out = __src;
        break;
      case 2:
        if (__src != (stbi_uc *)0x0) {
          memcpy(g->out,__src,(long)(g->w * 4 * g->h));
        }
        stbi__fill_gif_background(g,g->start_x,g->start_y,g->max_x,g->max_y);
        break;
      case 3:
        if (g->old_out != (stbi_uc *)0x0) {
          for (prev_out._0_4_ = g->start_y; (int)prev_out < g->max_y;
              prev_out._0_4_ = g->w * 4 + (int)prev_out) {
            memcpy(g->out + ((int)prev_out + g->start_x),g->old_out + ((int)prev_out + g->start_x),
                   (long)(g->max_x - g->start_x));
          }
        }
      }
      while (sVar1 = stbi__get8(s), sVar1 == '!') {
        sVar1 = stbi__get8(s);
        if (sVar1 == 0xf9) {
          bVar2 = stbi__get8(s);
          if (bVar2 == 4) {
            bVar2 = stbi__get8(s);
            g->eflags = (uint)bVar2;
            iVar3 = stbi__get16le(s);
            g->delay = iVar3;
            bVar2 = stbi__get8(s);
            g->transparent = (uint)bVar2;
            goto LAB_001297d5;
          }
          stbi__skip(s,(uint)bVar2);
        }
        else {
LAB_001297d5:
          while( true ) {
            bVar2 = stbi__get8(s);
            if (bVar2 == 0) break;
            stbi__skip(s,(uint)bVar2);
          }
        }
      }
      if (sVar1 == ',') {
        y = -1;
        iVar3 = stbi__get16le(s);
        iVar4 = stbi__get16le(s);
        iVar5 = stbi__get16le(s);
        iVar6 = stbi__get16le(s);
        if ((g->w < iVar3 + iVar5) || (g->h < iVar4 + iVar6)) {
          stbi__err("bad Image Descriptor");
          s_local = (stbi__context *)0x0;
        }
        else {
          g->line_size = g->w << 2;
          g->start_x = iVar3 << 2;
          g->start_y = iVar4 * g->line_size;
          g->max_x = g->start_x + iVar5 * 4;
          g->max_y = g->start_y + iVar6 * g->line_size;
          g->cur_x = g->start_x;
          g->cur_y = g->start_y;
          bVar2 = stbi__get8(s);
          g->lflags = (uint)bVar2;
          if ((g->lflags & 0x40U) == 0) {
            g->step = g->line_size;
            g->parse = 0;
          }
          else {
            g->step = g->line_size << 3;
            g->parse = 3;
          }
          if ((g->lflags & 0x80U) == 0) {
            if ((g->flags & 0x80U) == 0) {
              stbi__err("missing color table");
              return (stbi_uc *)0x0;
            }
            if ((-1 < g->transparent) && ((g->eflags & 1U) != 0)) {
              y = (stbi__int32)g->pal[g->transparent][3];
              g->pal[g->transparent][3] = '\0';
            }
            g->color_table = g->pal[0];
          }
          else {
            if ((g->eflags & 1U) == 0) {
              local_84 = -1;
            }
            else {
              local_84 = g->transparent;
            }
            stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)g->lflags & 7),local_84);
            g->color_table = g->lpal[0];
          }
          s_local = (stbi__context *)stbi__process_gif_raster(s,g);
          if (s_local == (stbi__context *)0x0) {
            s_local = (stbi__context *)0x0;
          }
          else if (y != -1) {
            g->pal[g->transparent][3] = (stbi_uc)y;
          }
        }
      }
      else {
        s_local = s;
        if (sVar1 != ';') {
          stbi__err("unknown code");
          s_local = (stbi__context *)0x0;
        }
      }
    }
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp)
{
   int i;
   stbi_uc *prev_out = 0;

   if (g->out == 0 && !stbi__gif_header(s, g, comp,0))
      return 0; // stbi__g_failure_reason set by stbi__gif_header

   prev_out = g->out;
   g->out = (stbi_uc *) stbi__malloc(4 * g->w * g->h);
   if (g->out == 0) return stbi__errpuc("outofmem", "Out of memory");

   switch ((g->eflags & 0x1C) >> 2) {
      case 0: // unspecified (also always used on 1st frame)
         stbi__fill_gif_background(g, 0, 0, 4 * g->w, 4 * g->w * g->h);
         break;
      case 1: // do not dispose
         if (prev_out) memcpy(g->out, prev_out, 4 * g->w * g->h);
         g->old_out = prev_out;
         break;
      case 2: // dispose to background
         if (prev_out) memcpy(g->out, prev_out, 4 * g->w * g->h);
         stbi__fill_gif_background(g, g->start_x, g->start_y, g->max_x, g->max_y);
         break;
      case 3: // dispose to previous
         if (g->old_out) {
            for (i = g->start_y; i < g->max_y; i += 4 * g->w)
               memcpy(&g->out[i + g->start_x], &g->old_out[i + g->start_x], g->max_x - g->start_x);
         }
         break;
   }

   for (;;) {
      switch (stbi__get8(s)) {
         case 0x2C: /* Image Descriptor */
         {
            int prev_trans = -1;
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               if (g->transparent >= 0 && (g->eflags & 0x01)) {
                  prev_trans = g->pal[g->transparent][3];
                  g->pal[g->transparent][3] = 0;
               }
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (o == NULL) return NULL;

            if (prev_trans != -1)
               g->pal[g->transparent][3] = (stbi_uc) prev_trans;

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            if (stbi__get8(s) == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = stbi__get16le(s);
                  g->transparent = stbi__get8(s);
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0)
               stbi__skip(s, len);
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }

   STBI_NOTUSED(req_comp);
}